

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivisor.c
# Opt level: O0

void Mvc_CoverDivisorZeroKernel(Mvc_Cover_t *pCover)

{
  int iLit_00;
  int iLit;
  Mvc_Cover_t *pCover_local;
  
  iLit_00 = Mvc_CoverWorstLiteral(pCover,(Mvc_Cube_t *)0x0);
  if (iLit_00 != -1) {
    Mvc_CoverDivideByLiteralQuo(pCover,iLit_00);
    Mvc_CoverMakeCubeFree(pCover);
    Mvc_CoverDivisorZeroKernel(pCover);
  }
  return;
}

Assistant:

void Mvc_CoverDivisorZeroKernel( Mvc_Cover_t * pCover )
{
    int iLit;
    // find any literal that occurs at least two times
//    iLit = Mvc_CoverAnyLiteral( pCover, NULL );
    iLit = Mvc_CoverWorstLiteral( pCover, NULL );
//    iLit = Mvc_CoverBestLiteral( pCover, NULL );
    if ( iLit == -1 )
        return;
    // derive the cube-free quotient
    Mvc_CoverDivideByLiteralQuo( pCover, iLit ); // the same cover
    Mvc_CoverMakeCubeFree( pCover );             // the same cover
    // call recursively
    Mvc_CoverDivisorZeroKernel( pCover );              // the same cover
}